

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_update_recv_stream_window_size
              (nghttp2_session *session,nghttp2_stream *stream,size_t delta_size,
              int send_window_update)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  
  iVar1 = stream->recv_window_size;
  uVar3 = (uint)delta_size;
  if ((int)(uVar3 ^ 0x7fffffff) < iVar1 || (int)(stream->local_window_size - uVar3) < iVar1) {
    iVar1 = nghttp2_session_add_rst_stream(session,stream->stream_id,3);
    return iVar1;
  }
  stream->recv_window_size = iVar1 + uVar3;
  iVar4 = 0;
  iVar2 = 0;
  if (((send_window_update != 0) && (iVar2 = iVar4, (session->opt_flags & 1) == 0)) &&
     (stream->window_update_queued == '\0')) {
    iVar1 = nghttp2_should_send_window_update(stream->local_window_size,iVar1 + uVar3);
    if (iVar1 != 0) {
      iVar2 = nghttp2_session_add_window_update
                        (session,'\0',stream->stream_id,stream->recv_window_size);
      if (iVar2 == 0) {
        stream->recv_window_size = 0;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int nghttp2_session_update_recv_stream_window_size(nghttp2_session *session,
                                                   nghttp2_stream *stream,
                                                   size_t delta_size,
                                                   int send_window_update) {
  int rv;
  rv = adjust_recv_window_size(&stream->recv_window_size, delta_size,
                               stream->local_window_size);
  if (rv != 0) {
    return nghttp2_session_add_rst_stream(session, stream->stream_id,
                                          NGHTTP2_FLOW_CONTROL_ERROR);
  }
  /* We don't have to send WINDOW_UPDATE if the data received is the
     last chunk in the incoming stream. */
  /* We have to use local_settings here because it is the constraint
     the remote endpoint should honor. */
  if (send_window_update &&
      !(session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE) &&
      stream->window_update_queued == 0 &&
      nghttp2_should_send_window_update(stream->local_window_size,
                                        stream->recv_window_size)) {
    rv = nghttp2_session_add_window_update(session, NGHTTP2_FLAG_NONE,
                                           stream->stream_id,
                                           stream->recv_window_size);
    if (rv != 0) {
      return rv;
    }

    stream->recv_window_size = 0;
  }
  return 0;
}